

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O3

void __thiscall
CMeshClosestPointMapper::CMeshClosestPointMapper
          (CMeshClosestPointMapper *this,ON_Mesh *mesh,ON_2fPointArray *tc,
          ON_RenderMeshInfo *pRenderMeshInfo,ON_Xform *objectXform)

{
  ON_Mesh *this_00;
  int iVar1;
  int iVar2;
  int *piVar3;
  bool bVar4;
  int iVar5;
  ON_MappingMeshInfo *pOVar6;
  ON_RTree *this_01;
  CMeshClosestPointMapper *this_02;
  long lVar7;
  ON_Xform *pOVar8;
  ON_Xform *pOVar9;
  byte bVar10;
  
  bVar10 = 0;
  (this->super_IClosestPointMapper)._vptr_IClosestPointMapper =
       (_func_int **)&PTR__CMeshClosestPointMapper_00813798;
  this->m_mesh = mesh;
  this->m_tc = tc;
  pOVar6 = ON_Mesh::GetMappingMeshInfo(mesh);
  this->m_pMappingMeshInfo = pOVar6;
  this->m_pRenderMeshInfo = pRenderMeshInfo;
  (this->m_resFis)._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_00808cb8;
  (this->m_resFis).m_a = (int *)0x0;
  (this->m_resFis).m_count = 0;
  (this->m_resFis).m_capacity = 0;
  pOVar8 = objectXform;
  pOVar9 = &this->m_objectXform;
  for (lVar7 = 0x10; lVar7 != 0; lVar7 = lVar7 + -1) {
    pOVar9->m_xform[0][0] = pOVar8->m_xform[0][0];
    pOVar8 = (ON_Xform *)((long)pOVar8 + ((ulong)bVar10 * -2 + 1) * 8);
    pOVar9 = (ON_Xform *)((long)pOVar9 + (ulong)bVar10 * -0x10 + 8);
  }
  this_00 = &this->m_sourceMesh;
  ON_Mesh::ON_Mesh(this_00);
  this->m_pSourceCPM = (CMeshClosestPointMapper *)0x0;
  (this->m_seamTool)._vptr_SeamTool = (_func_int **)&PTR__SeamTool_008137f8;
  (this->m_seamTool).m_mesh = mesh;
  (this->m_seamTool).m_tc = tc;
  (this->m_seamTool).m_bProcessed = false;
  (this->m_seamTool).m_faceData = (Data *)0x0;
  (this->m_seamTool).m_bHasSeams = false;
  ON_RTree::ON_RTree(&(this->m_seamTool).m_seamTree,0);
  this->m_totalMappingTol = 0.0;
  this->m_failedFaceMatches = 0;
  this_01 = (ON_RTree *)operator_new(0x48);
  ON_RTree::ON_RTree(this_01,0);
  this->m_pMeshFaceTree = this_01;
  ON_RTree::CreateMeshFaceTree(this_01,mesh);
  this->m_bMeshInfosMatch = false;
  if ((this->m_pMappingMeshInfo != (ON_MappingMeshInfo *)0x0) &&
     (this->m_pRenderMeshInfo != (ON_RenderMeshInfo *)0x0)) {
    bVar4 = ON_GeometryFingerprint::Matches
                      (&this->m_pMappingMeshInfo->m_geometryFingerprint,
                       &this->m_pRenderMeshInfo->m_geometryFingerprint,&this->m_objectXform,0.001);
    if (bVar4) {
      this->m_bMeshInfosMatch = true;
      iVar1 = this->m_pRenderMeshInfo->m_sourceFaceId;
      lVar7 = (long)iVar1;
      if ((-1 < lVar7) &&
         (pOVar6 = this->m_pMappingMeshInfo, iVar1 < (pOVar6->m_sourceIdFaceCount).m_count)) {
        iVar1 = (pOVar6->m_sourceIdFaceCount).m_a[lVar7];
        piVar3 = (pOVar6->m_sourceIdFaceList).m_a;
        if (piVar3 != (int *)0x0 && 0 < iVar1) {
          iVar2 = (pOVar6->m_sourceIdFaceStart).m_a[lVar7];
          iVar5 = ON_Mesh::FaceCount(this->m_mesh);
          if (iVar1 < iVar5) {
            bVar4 = CreateSubMesh(this->m_mesh,this->m_tc,iVar1,piVar3 + iVar2,this_00);
            if (bVar4) {
              this_02 = (CMeshClosestPointMapper *)operator_new(0x840);
              CMeshClosestPointMapper
                        (this_02,this_00,&(this->m_sourceMesh).m_T,(ON_RenderMeshInfo *)0x0,
                         objectXform);
              this->m_pSourceCPM = this_02;
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

CMeshClosestPointMapper(const ON_Mesh& mesh, const ON_2fPointArray& tc, const ON_RenderMeshInfo* pRenderMeshInfo, const ON_Xform& objectXform)
	: m_mesh(mesh),
		m_tc(tc),
		m_pMappingMeshInfo(mesh.GetMappingMeshInfo()),
		m_pRenderMeshInfo(pRenderMeshInfo),
		m_objectXform(objectXform),
		m_pSourceCPM(nullptr),
		m_totalMappingTol(0.0),
		m_failedFaceMatches(0),
		m_seamTool(mesh, tc)
	{
    m_pMeshFaceTree = new ON_RTree();
    m_pMeshFaceTree->CreateMeshFaceTree(&mesh);
		m_bMeshInfosMatch = false;
		if (m_pMappingMeshInfo != nullptr && m_pRenderMeshInfo != nullptr)
		{
			if (m_pMappingMeshInfo->m_geometryFingerprint.Matches(m_pRenderMeshInfo->m_geometryFingerprint, m_objectXform, 0.001))
			{
				m_bMeshInfosMatch = true;
				int nFis = 0;
				const int* pFis = m_pMappingMeshInfo->SourceIdFaces(m_pRenderMeshInfo->m_sourceFaceId, nFis);
				if (nFis > 0 && pFis != nullptr && nFis < m_mesh.FaceCount())
				{
					if (CreateSubMesh(m_mesh, m_tc, nFis, pFis, m_sourceMesh))
					{
						m_pSourceCPM = new CMeshClosestPointMapper(m_sourceMesh, m_sourceMesh.m_T, nullptr, objectXform);
					}
				}
			}
		}
	}